

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionController::TransactionController
          (TransactionController *this,TransactionController *transaction)

{
  AbstractTransactionController *in_stack_ffffffffffffffa8;
  string *tx_hex;
  TransactionController *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  tx_hex = local_30;
  AbstractTransactionController::GetHex_abi_cxx11_(in_stack_ffffffffffffffa8);
  TransactionController(in_stack_ffffffffffffffc0,tx_hex);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TransactionController::TransactionController(
    const TransactionController& transaction)
    : TransactionController(transaction.GetHex()) {
  // do nothing
}